

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3GetDeltaVarint3(char **pp,char *pEnd,int bDescIdx,sqlite3_int64 *pVal)

{
  int iVar1;
  long *in_RCX;
  int in_EDX;
  ulong in_RSI;
  ulong *in_RDI;
  long in_FS_OFFSET;
  u64 iVal;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI < in_RSI) {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    iVar1 = sqlite3Fts3GetVarintU((char *)*in_RDI,(sqlite_uint64 *)&local_10);
    *in_RDI = *in_RDI + (long)iVar1;
    if (in_EDX == 0) {
      *in_RCX = (long)(local_10 + *in_RCX);
    }
    else {
      *in_RCX = *in_RCX - (long)local_10;
    }
  }
  else {
    *in_RDI = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3GetDeltaVarint3(
  char **pp,                      /* IN/OUT: Point to read varint from */
  char *pEnd,                     /* End of buffer */
  int bDescIdx,                   /* True if docids are descending */
  sqlite3_int64 *pVal             /* IN/OUT: Integer value */
){
  if( *pp>=pEnd ){
    *pp = 0;
  }else{
    u64 iVal;
    *pp += sqlite3Fts3GetVarintU(*pp, &iVal);
    if( bDescIdx ){
      *pVal = (i64)((u64)*pVal - iVal);
    }else{
      *pVal = (i64)((u64)*pVal + iVal);
    }
  }
}